

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O2

int simple_motion_search_get_best_ref
              (AV1_COMP *cpi,MACROBLOCK *x,SIMPLE_MOTION_DATA_TREE *sms_tree,int mi_row,int mi_col,
              BLOCK_SIZE bsize,int *refs,int num_refs,int use_subpixel,int save_mv,uint *best_sse,
              uint *best_var)

{
  int ref;
  uint *puVar1;
  int r_idx;
  int_mv iVar2;
  ulong in_RAX;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined4 in_stack_0000001c;
  undefined4 in_stack_00000024;
  uint curr_sse;
  uint curr_var;
  
  puVar1 = (uint *)CONCAT44(in_stack_0000001c,use_subpixel);
  if ((mi_col < (cpi->common).mi_params.mi_cols) && (mi_row < (cpi->common).mi_params.mi_rows)) {
    *puVar1 = 0x7fffffff;
    ref = *refs;
    in_RAX = (ulong)""[ref];
    if ((cpi->ref_frame_flags & (uint)""[ref]) != 0) {
      _curr_sse = 0;
      iVar2 = av1_simple_motion_search_sse_var
                        (cpi,x,mi_row,mi_col,bsize,ref,sms_tree->start_mvs[ref],1,1,&curr_sse,
                         &curr_var);
      in_RAX = (ulong)iVar2.as_int;
      if (curr_sse < *puVar1) {
        *puVar1 = curr_sse;
        *(uint *)CONCAT44(in_stack_00000024,save_mv) = curr_var;
      }
      if (num_refs != 0) {
        auVar3 = psraw(ZEXT416(iVar2.as_int),0xf);
        auVar4._4_2_ = auVar3._4_2_ >> 0xd;
        auVar4._6_2_ = auVar3._6_2_ >> 0xd;
        auVar4._8_2_ = auVar3._8_2_ >> 0xd;
        auVar4._10_2_ = auVar3._10_2_ >> 0xd;
        auVar4._12_2_ = auVar3._12_2_ >> 0xd;
        auVar4._14_2_ = auVar3._14_2_ >> 0xd;
        auVar4._0_2_ = (auVar3._0_2_ >> 0xd) + iVar2.as_mv.row;
        auVar4._2_2_ = (auVar3._2_2_ >> 0xd) + iVar2.as_mv.col;
        auVar3 = psraw(auVar4,3);
        sms_tree->start_mvs[ref] = auVar3._0_4_;
        if (BLOCK_8X4 < bsize) {
          for (in_RAX = 0; in_RAX != 4; in_RAX = in_RAX + 1) {
            sms_tree->split[in_RAX]->start_mvs[ref] = sms_tree->start_mvs[ref];
          }
        }
      }
    }
  }
  else {
    *(uint *)CONCAT44(in_stack_00000024,save_mv) = 0;
    *puVar1 = 0;
  }
  return (int)in_RAX;
}

Assistant:

static int simple_motion_search_get_best_ref(
    AV1_COMP *const cpi, MACROBLOCK *x, SIMPLE_MOTION_DATA_TREE *sms_tree,
    int mi_row, int mi_col, BLOCK_SIZE bsize, const int *const refs,
    int num_refs, int use_subpixel, int save_mv, unsigned int *best_sse,
    unsigned int *best_var) {
  const AV1_COMMON *const cm = &cpi->common;
  int best_ref = -1;

  if (mi_col >= cm->mi_params.mi_cols || mi_row >= cm->mi_params.mi_rows) {
    // If the whole block is outside of the image, set the var and sse to 0.
    *best_var = 0;
    *best_sse = 0;

    return best_ref;
  }

  // Otherwise do loop through the reference frames and find the one with the
  // minimum SSE
  const int num_planes = 1;

  *best_sse = INT_MAX;

  for (int ref_idx = 0; ref_idx < num_refs; ref_idx++) {
    const int ref = refs[ref_idx];

    if (cpi->ref_frame_flags & av1_ref_frame_flag_list[ref]) {
      const FULLPEL_MV *start_mvs = sms_tree->start_mvs;
      unsigned int curr_sse = 0, curr_var = 0;
      const int_mv best_mv = av1_simple_motion_search_sse_var(
          cpi, x, mi_row, mi_col, bsize, ref, start_mvs[ref], num_planes,
          use_subpixel, &curr_sse, &curr_var);
      if (curr_sse < *best_sse) {
        *best_sse = curr_sse;
        *best_var = curr_var;
        best_ref = ref;
      }

      if (save_mv) {
        sms_tree->start_mvs[ref].row = best_mv.as_mv.row / 8;
        sms_tree->start_mvs[ref].col = best_mv.as_mv.col / 8;

        if (bsize >= BLOCK_8X8) {
          for (int r_idx = 0; r_idx < SUB_PARTITIONS_SPLIT; r_idx++) {
            // Propagate the new motion vectors to a lower level
            SIMPLE_MOTION_DATA_TREE *sub_tree = sms_tree->split[r_idx];
            sub_tree->start_mvs[ref] = sms_tree->start_mvs[ref];
          }
        }
      }
    }
  }

  return best_ref;
}